

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printSolutionStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,ostream *os)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ostream *in_RSI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxviol_1;
  Rational sumviol;
  Rational maxviol;
  fmtflags in_stack_fffffffffffffb4c;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffb50;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb58;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbd8;
  ostream *in_stack_fffffffffffffbe0;
  Rational *in_stack_fffffffffffffcf8;
  Rational *in_stack_fffffffffffffd00;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd08;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd80;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd88;
  string local_268 [32];
  string local_248 [32];
  string local_228 [16];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffde8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdf0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdf8;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffea8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffeb0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffeb8;
  Rational *in_stack_ffffffffffffff78;
  Rational *in_stack_ffffffffffffff80;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff88;
  
  SPxOut::setScientific((ostream *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
  if (in_RDI->_lastSolveMode == 0) {
    poVar3 = std::operator<<(in_RSI,"Solution (real)     : \n");
    std::operator<<(poVar3,"  Objective value   : ");
    objValueReal(in_stack_fffffffffffffb88);
    poVar3 = boost::multiprecision::operator<<(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    std::operator<<(poVar3,"\n");
  }
  else if (in_RDI->_lastSolveMode == 2) {
    poVar3 = std::operator<<(in_RSI,"Solution (rational) : \n");
    std::operator<<(poVar3,"  Objective value   : ");
    objValueRational(in_stack_fffffffffffffb58);
    poVar3 = boost::multiprecision::operator<<
                       (in_stack_fffffffffffffbe0,
                        (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)in_stack_fffffffffffffbd8);
    std::operator<<(poVar3,"\n");
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x7d9a92);
    poVar3 = std::operator<<(in_RSI,"Size (base 2/10)    : \n");
    poVar3 = std::operator<<(poVar3,"  Total primal      : ");
    iVar2 = totalSizePrimalRational
                      (in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = totalSizePrimalRational
                      (in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  Total dual        : ");
    iVar2 = totalSizeDualRational
                      (in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = totalSizeDualRational
                      (in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  DLCM primal       : ");
    iVar2 = dlcmSizePrimalRational
                      (in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = dlcmSizePrimalRational
                      (in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  DLCM dual         : ");
    iVar2 = dlcmSizeDualRational
                      (in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = dlcmSizeDualRational
                      (in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  DMAX primal       : ");
    iVar2 = dmaxSizePrimalRational
                      (in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = dmaxSizePrimalRational
                      (in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  DMAX dual         : ");
    iVar2 = dmaxSizeDualRational
                      (in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = dmaxSizeDualRational
                      (in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,"\n");
  }
  else {
    poVar3 = std::operator<<(in_RSI,"Solution            : \n");
    std::operator<<(poVar3,"  Objective value   : -\n");
  }
  iVar2 = intParam(in_RDI,CHECKMODE);
  if ((iVar2 == 2) ||
     ((iVar2 = intParam(in_RDI,CHECKMODE), iVar2 == 1 &&
      (iVar2 = intParam(in_RDI,READMODE), iVar2 == 1)))) {
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x7d9e57);
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x7d9e74);
    std::operator<<(in_RSI,"Violation (rational): \n");
    bVar1 = getBoundViolationRational
                      (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8
                      );
    if (bVar1) {
      poVar3 = std::operator<<(in_RSI,"  Max/sum bound     : ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffb58,(streamsize)in_stack_fffffffffffffb50,
                       in_stack_fffffffffffffb4c);
      poVar3 = std::operator<<(poVar3,local_1a8);
      poVar3 = std::operator<<(poVar3," / ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffb58,(streamsize)in_stack_fffffffffffffb50,
                       in_stack_fffffffffffffb4c);
      poVar3 = std::operator<<(poVar3,local_1c8);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_1a8);
    }
    else {
      std::operator<<(in_RSI,"  Max/sum bound     : - / -\n");
    }
    bVar1 = getRowViolationRational
                      (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8
                      );
    if (bVar1) {
      poVar3 = std::operator<<(in_RSI,"  Max/sum row       : ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffb58,(streamsize)in_stack_fffffffffffffb50,
                       in_stack_fffffffffffffb4c);
      poVar3 = std::operator<<(poVar3,local_1e8);
      poVar3 = std::operator<<(poVar3," / ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffb58,(streamsize)in_stack_fffffffffffffb50,
                       in_stack_fffffffffffffb4c);
      poVar3 = std::operator<<(poVar3,(string *)&stack0xfffffffffffffdf8);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
      std::__cxx11::string::~string(local_1e8);
    }
    else {
      std::operator<<(in_RSI,"  Max/sum row       : - / -\n");
    }
    bVar1 = getRedCostViolationRational
                      (in_stack_fffffffffffffd88,(Rational *)in_stack_fffffffffffffd80,
                       (Rational *)in_stack_fffffffffffffd78);
    if (bVar1) {
      poVar3 = std::operator<<(in_RSI,"  Max/sum redcost   : ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffb58,(streamsize)in_stack_fffffffffffffb50,
                       in_stack_fffffffffffffb4c);
      poVar3 = std::operator<<(poVar3,local_228);
      poVar3 = std::operator<<(poVar3," / ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffb58,(streamsize)in_stack_fffffffffffffb50,
                       in_stack_fffffffffffffb4c);
      poVar3 = std::operator<<(poVar3,local_248);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_228);
    }
    else {
      std::operator<<(in_RSI,"  Max/sum redcost   : - / -\n");
    }
    bVar1 = getDualViolationRational
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                      );
    if (bVar1) {
      poVar3 = std::operator<<(in_RSI,"  Max/sum dual      : ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffb58,(streamsize)in_stack_fffffffffffffb50,
                       in_stack_fffffffffffffb4c);
      poVar3 = std::operator<<(poVar3,local_268);
      poVar3 = std::operator<<(poVar3," / ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)poVar3,(streamsize)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
      poVar3 = std::operator<<(poVar3,(string *)&stack0xfffffffffffffd78);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
      std::__cxx11::string::~string(local_268);
    }
    else {
      std::operator<<(in_RSI,"  Max/sum dual      : - / -\n");
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x7da457);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x7da464);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffb50);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffb50);
    std::operator<<(in_RSI,"Violations (real)   : \n");
    bVar1 = getBoundViolation(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                              in_stack_fffffffffffffd78);
    if (bVar1) {
      std::operator<<(in_RSI,"  Max/sum bound     : ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      std::operator<<(poVar3," / ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      std::operator<<(poVar3,"\n");
    }
    else {
      std::operator<<(in_RSI,"  Max/sum bound     : - / -\n");
    }
    bVar1 = getRowViolation(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                            in_stack_fffffffffffffde8);
    if (bVar1) {
      std::operator<<(in_RSI,"  Max/sum row       : ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      std::operator<<(poVar3," / ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      std::operator<<(poVar3,"\n");
    }
    else {
      std::operator<<(in_RSI,"  Max/sum row       : - / -\n");
    }
    bVar1 = getRedCostViolation(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                in_stack_fffffffffffffea8);
    if (bVar1) {
      std::operator<<(in_RSI,"  Max/sum redcost   : ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      std::operator<<(poVar3," / ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      std::operator<<(poVar3,"\n");
    }
    else {
      std::operator<<(in_RSI,"  Max/sum redcost   : - / -\n");
    }
    bVar1 = getDualViolation(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                             in_stack_fffffffffffffea8);
    if (bVar1) {
      std::operator<<(in_RSI,"  Max/sum dual      : ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      std::operator<<(poVar3," / ");
      poVar3 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      std::operator<<(poVar3,"\n");
    }
    else {
      std::operator<<(in_RSI,"  Max/sum dual      : - / -\n");
    }
  }
  return;
}

Assistant:

void SoPlexBase<R>::printSolutionStatistics(std::ostream& os)
{
   SPxOut::setScientific(os);

   if(_lastSolveMode == SOLVEMODE_REAL)
   {
      os << "Solution (real)     : \n"
         << "  Objective value   : " << objValueReal() << "\n";
   }
   else if(_lastSolveMode == SOLVEMODE_RATIONAL)
   {
      os << "Solution (rational) : \n"
         << "  Objective value   : " << objValueRational() << "\n";
      os << "Size (base 2/10)    : \n"
         << "  Total primal      : " << totalSizePrimalRational() << " / " << totalSizePrimalRational(
            10) << "\n"
         << "  Total dual        : " << totalSizeDualRational() << " / " << totalSizeDualRational(10) << "\n"
         << "  DLCM primal       : " << dlcmSizePrimalRational() << " / " << dlcmSizePrimalRational(
            10) << "\n"
         << "  DLCM dual         : " << dlcmSizeDualRational() << " / " << dlcmSizeDualRational(10) << "\n"
         << "  DMAX primal       : " << dmaxSizePrimalRational() << " / " << dmaxSizePrimalRational(
            10) << "\n"
         << "  DMAX dual         : " << dmaxSizeDualRational() << " / " << dmaxSizeDualRational(10) << "\n";
   }
   else
   {
      os << "Solution            : \n"
         << "  Objective value   : -\n";
   }

   if(intParam(CHECKMODE) == CHECKMODE_RATIONAL
         || (intParam(CHECKMODE) == CHECKMODE_AUTO && intParam(READMODE) == READMODE_RATIONAL))
   {
      Rational maxviol;
      Rational sumviol;

      os << "Violation (rational): \n";

      if(getBoundViolationRational(maxviol, sumviol))
         os << "  Max/sum bound     : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum bound     : - / -\n";

      if(getRowViolationRational(maxviol, sumviol))
         os << "  Max/sum row       : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum row       : - / -\n";

      if(getRedCostViolationRational(maxviol, sumviol))
         os << "  Max/sum redcost   : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum redcost   : - / -\n";

      if(getDualViolationRational(maxviol, sumviol))
         os << "  Max/sum dual      : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum dual      : - / -\n";
   }
   else
   {
      R maxviol;
      R sumviol;

      os << "Violations (real)   : \n";

      if(getBoundViolation(maxviol, sumviol))
         os << "  Max/sum bound     : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum bound     : - / -\n";

      if(getRowViolation(maxviol, sumviol))
         os << "  Max/sum row       : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum row       : - / -\n";

      if(getRedCostViolation(maxviol, sumviol))
         os << "  Max/sum redcost   : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum redcost   : - / -\n";

      if(getDualViolation(maxviol, sumviol))
         os << "  Max/sum dual      : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum dual      : - / -\n";
   }
}